

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceObjectArchive::DeviceObjectArchive(DeviceObjectArchive *this,Uint32 ContentVersion)

{
  (this->m_NamedResources)._M_h._M_buckets = &(this->m_NamedResources)._M_h._M_single_bucket;
  (this->m_NamedResources)._M_h._M_bucket_count = 1;
  (this->m_NamedResources)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_NamedResources)._M_h._M_element_count = 0;
  (this->m_NamedResources)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memset(&(this->m_NamedResources)._M_h._M_rehash_policy._M_next_resize,0,0xc0);
  this->m_ContentVersion = ContentVersion;
  return;
}

Assistant:

DeviceObjectArchive::DeviceObjectArchive(Uint32 ContentVersion) noexcept :
    m_ContentVersion{ContentVersion}
{
}